

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::Galactic2Observed
              (double glon,double glat,double *az,double *zen,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength,
              double *observed_glon,double *observed_glat,double *hour_angle)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_R8;
  CEAngleType *in_stack_00000018;
  CEDate *in_stack_00000020;
  double *in_stack_00000028;
  double *in_stack_00000030;
  double *in_stack_00000038;
  int err_code;
  double in_stack_00000048;
  double in_stack_00000050;
  CEDate date;
  double dec;
  double ra;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  double temp_glat;
  double temp_glon;
  undefined8 in_stack_fffffffffffffee0;
  CEAngleType *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  double *dec_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  double in_stack_ffffffffffffff10;
  double local_e0 [8];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  local_58 = in_RDX;
  if (in_RDX == (undefined8 *)0x0) {
    local_58 = &local_70;
  }
  local_60 = in_RCX;
  if (in_RCX == (undefined8 *)0x0) {
    local_60 = &local_78;
  }
  local_68 = in_R8;
  if (in_R8 == (undefined8 *)0x0) {
    local_68 = &local_90;
  }
  local_98 = 0;
  local_a0 = 0;
  dec_00 = local_e0;
  CEDate::CEDate((CEDate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (double)in_stack_fffffffffffffee8,
                 (CEDateType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  Galactic2CIRS(in_stack_ffffffffffffff10,
                (double)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),dec_00,
                (CEDate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffee8);
  iVar1 = CIRS2Observed((double)date._56_8_,
                        (double)date.gregorian_date_vect_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,
                        date.gregorian_date_vect_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                        date.gregorian_date_vect_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,date.gregorian_date_,date.mod_julian_date_,
                        date.julian_date_,(double)date._vptr_CEDate,in_stack_00000050,
                        in_stack_00000048,ra,temp_hour_angle,temp_dec,temp_ra,temp_glat,_err_code,
                        in_stack_00000038,in_stack_00000030);
  CIRS2Galactic((double)CONCAT44(1,in_stack_ffffffffffffff00),(double)dec_00,
                (double *)CONCAT44(iVar1,in_stack_fffffffffffffef0),in_stack_00000028,
                in_stack_00000020,in_stack_00000018);
  CEDate::~CEDate((CEDate *)0x130965);
  return iVar1;
}

Assistant:

int CECoordinates::Galactic2Observed(double glon, double glat,
                                     double *az, double *zen,
                                     double julian_date,
                                     double longitude,
                                     double latitude,
                                     double elevation_m,
                                     double pressure_hPa,
                                     double temperature_celsius,
                                     double relative_humidity,
                                     double dut1,
                                     double xp, double yp,
                                     double wavelength,
                                     double *observed_glon,
                                     double *observed_glat,
                                     double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_glon(0.0);
    double temp_glat(0.0);
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were passed, point these variables at the passed ones
    if (observed_glon == nullptr) observed_glon = &temp_glon;
    if (observed_glat == nullptr) observed_glat = &temp_glat;
    if (hour_angle    == nullptr) hour_angle    = &temp_hour_angle;
    
    // Convert GALACTIC to ICRS
    double ra(0.0);
    double dec(0.0);
    CEDate date(julian_date, CEDateType::JD) ;
    Galactic2CIRS(glon, glat, &ra, &dec, date) ;

    // Call the necessary sofa method
    int err_code = CIRS2Observed(ra, dec,
                                 az, zen,
                                 julian_date,
                                 longitude,
                                 latitude,
                                 elevation_m,
                                 pressure_hPa,
                                 temperature_celsius,
                                 relative_humidity,
                                 dut1, xp, yp,
                                 wavelength,
                                 &temp_ra,
                                 &temp_dec,
                                 &temp_hour_angle) ;

    // Convert the apparent RA,Dec to galactic longitude,latitude
    CIRS2Galactic(temp_ra, temp_dec, observed_glon, observed_glat, date) ;
    
    return err_code ;
}